

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
tf::TFProfManager::_manage(TFProfManager *this,shared_ptr<tf::TFProfObserver> *observer)

{
  std::mutex::lock(&this->_mutex);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>::
  emplace_back<std::shared_ptr<tf::TFProfObserver>>
            ((vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>
              *)&this->_observers,observer);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

inline void TFProfManager::_manage(std::shared_ptr<TFProfObserver> observer) {
  std::lock_guard lock(_mutex);
  _observers.push_back(std::move(observer));
}